

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseDecoder.cpp
# Opt level: O3

void __thiscall
siamese::RecoveryMatrixState::ResumeGE(RecoveryMatrixState *this,uint oldRows,uint rows)

{
  uint8_t uVar1;
  uint8_t y;
  uint uVar2;
  uint uVar3;
  uint8_t *puVar4;
  RowInfo *pRVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint8_t *vz;
  
  if ((oldRows < rows) && (this->GEResumePivot != 0)) {
    uVar2 = (this->Matrix).AllocatedColumns;
    uVar8 = 0;
    uVar7 = (ulong)(uVar2 * oldRows);
    pRVar5 = (this->Rows).DataPtr;
    do {
      uVar7 = uVar7 + 1;
      puVar4 = (this->Matrix).Data;
      uVar6 = (ulong)uVar8;
      uVar9 = (this->Pivots).DataPtr[(int)uVar8];
      uVar8 = uVar8 + 1;
      uVar3 = pRVar5[(int)uVar9].MatrixColumnCount;
      vz = puVar4 + uVar7;
      puVar4 = puVar4 + uVar6 + 1 + (ulong)(uVar9 * uVar2);
      uVar1 = puVar4[-1];
      uVar9 = oldRows;
      do {
        if (vz[-1] != '\0') {
          y = GF256Ctx.GF256_DIV_TABLE[CONCAT11(uVar1,vz[-1])];
          vz[-1] = y;
          gf256_muladd_mem(vz,y,puVar4,uVar3 - uVar8);
          pRVar5 = (this->Rows).DataPtr;
          if (pRVar5[(int)uVar9].MatrixColumnCount < uVar3) {
            pRVar5[(int)uVar9].MatrixColumnCount = uVar3;
          }
        }
        vz = vz + uVar2;
        uVar9 = uVar9 + 1;
      } while (rows != uVar9);
    } while (uVar8 < this->GEResumePivot);
  }
  return;
}

Assistant:

void RecoveryMatrixState::ResumeGE(const unsigned oldRows, const unsigned rows)
{
    // If we did not add any new rows:
    if (oldRows >= rows)
    {
        SIAMESE_DEBUG_ASSERT(oldRows == rows);
        return;
    }

    const unsigned stride = Matrix.AllocatedColumns;

    // For each pivot we have determined already:
    for (unsigned pivot_i = 0; pivot_i < GEResumePivot; ++pivot_i)
    {
        // Get the row for that pivot
        const unsigned matrixRowIndex_i = Pivots.GetRef(pivot_i);
        const uint8_t* ge_row = Matrix.Data + stride * matrixRowIndex_i;
        const uint8_t val_i   = ge_row[pivot_i];
        SIAMESE_DEBUG_ASSERT(val_i != 0);

        const unsigned pivotColumnCount = Rows.GetRef(matrixRowIndex_i).MatrixColumnCount;

        uint8_t* rem_row = Matrix.Data + stride * oldRows;

        // For each new row that was added:
        for (unsigned newRowIndex = oldRows; newRowIndex < rows; ++newRowIndex, rem_row += stride)
        {
            if (EliminateRow(ge_row, rem_row, pivot_i, pivotColumnCount, val_i))
            {
                // Grow the column count of this row if we just filled it in on the right
                if (Rows.GetRef(newRowIndex).MatrixColumnCount < pivotColumnCount)
                    Rows.GetRef(newRowIndex).MatrixColumnCount = pivotColumnCount;
            }
            SIAMESE_DEBUG_ASSERT(Pivots.GetRef(newRowIndex) == newRowIndex);
        }
    }
}